

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trmm.hpp
# Opt level: O1

void remora::bindings::
     trmm_impl<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::triangular_tag<true,false>>
               (long *e1,long e2)

{
  size_t __n;
  long lVar1;
  ulong uVar2;
  size_type sVar3;
  size_type sVar4;
  size_t stride1;
  pointer __ptr;
  pointer __ptr_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double *__s;
  ulong uVar10;
  long lVar11;
  size_type sVar12;
  long lVar13;
  size_t i;
  ulong uVar14;
  aligned_allocator<double,_64UL> allocator;
  long local_e0;
  ulong local_c8;
  type Bs;
  type As;
  
  __ptr = boost::alignment::aligned_allocator<double,_64UL>::allocate
                    (&allocator,0x4000,(const_void_pointer)0x0);
  __ptr_00 = boost::alignment::aligned_allocator<double,_64UL>::allocate
                       (&allocator,0x1fe00,(const_void_pointer)0x0);
  lVar1 = *(long *)(e2 + 8);
  if (0x3fb < lVar1 + 0x3fbU) {
    uVar2 = e1[1];
    local_e0 = *(long *)(e2 + 0x10);
    uVar6 = 0;
    do {
      uVar7 = lVar1 + uVar6 * -0x3fc;
      if (0x3fb < uVar7) {
        uVar7 = 0x3fc;
      }
      if (0x7f < uVar2 + 0x7f) {
        local_c8 = 1;
        uVar5 = 0;
        do {
          uVar9 = uVar2 + uVar5 * -0x80;
          if (0x7f < uVar9) {
            uVar9 = 0x80;
          }
          Bs.m_leading_dimension = *(size_type *)(e2 + 8);
          Bs.m_values = (double *)
                        (Bs.m_leading_dimension * uVar5 * 0x80 * 8 + *(long *)(e2 + 0x10) +
                        uVar6 * 0x1fe0);
          Bs.m_size1 = uVar9;
          Bs.m_size2 = uVar7;
          pack_B_dense<remora::dense_matrix_adaptor<double,remora::row_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::trmm_block_size<double>>
                    (&Bs);
          sVar4 = Bs.m_leading_dimension;
          sVar3 = Bs.m_size2;
          if (Bs.m_size1 != 0) {
            __n = Bs.m_size2 * 8;
            __s = Bs.m_values;
            sVar12 = Bs.m_size1;
            do {
              if (sVar3 != 0) {
                memset(__s,0,__n);
              }
              __s = __s + sVar4;
              sVar12 = sVar12 - 1;
            } while (sVar12 != 0);
          }
          lVar13 = 0;
          uVar14 = 0;
          uVar8 = uVar2;
          lVar11 = local_e0;
          do {
            uVar10 = 0x80;
            if (uVar8 < 0x80) {
              uVar10 = uVar8;
            }
            As.m_leading_dimension = e1[3];
            As.m_values = (double *)(As.m_leading_dimension * lVar13 * 8 + *e1 + uVar5 * 0x400);
            As.m_size1 = uVar10;
            As.m_size2 = uVar9;
            if (uVar5 == uVar14) {
              pack_A_triangular<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::trmm_block_size<double>,false>
                        ();
            }
            else {
              pack_A_dense<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::trmm_block_size<double>>
                        (&As,__ptr);
            }
            mgemm<double,double,remora::bindings::trmm_block_size<double>>
                      (0x3ff0000000000000,uVar10,uVar7,uVar9,__ptr,__ptr_00,lVar11,lVar1,1);
            uVar14 = uVar14 + 1;
            lVar13 = lVar13 + 0x80;
            uVar8 = uVar8 - 0x80;
            lVar11 = lVar11 + lVar1 * 0x400;
          } while (local_c8 != uVar14);
          uVar5 = uVar5 + 1;
          local_c8 = local_c8 + 1;
        } while (uVar5 != uVar2 + 0x7f >> 7);
      }
      uVar6 = uVar6 + 1;
      local_e0 = local_e0 + 0x1fe0;
    } while (uVar6 != (lVar1 + 0x3fbU) / 0x3fc);
  }
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void trmm_impl(
	matrix_expression<E1, cpu_tag> const& e1,
	matrix_expression<E2, cpu_tag> & e2,
	Triangular t
){
	typedef typename std::common_type<typename E1::value_type, typename E2::value_type>::type value_type;
	typedef trmm_block_size<value_type> block_size;

	static const std::size_t AC = block_size::lhs_block_size;
	static const std::size_t BC = block_size::rhs_column_size;

	//obtain uninitialized aligned storage
	boost::alignment::aligned_allocator<value_type,block_size::block::align> allocator;
	value_type* A = allocator.allocate(AC * AC);
	value_type* B = allocator.allocate(AC * BC);

	//figure out number of blocks to use
	const std::size_t  M = e1().size1();
	const std::size_t  N = e2().size2();
	const std::size_t Ab = (M+AC-1) / AC;
	const std::size_t Bb = (N+BC-1) / BC;

	//get access to raw storage of B
	auto storageB = e2().raw_storage();
	auto Bpointer = storageB.values;
	const std::size_t stride1 = E2::orientation::index_M(storageB.leading_dimension,1);
	const std::size_t stride2 = E2::orientation::index_m(storageB.leading_dimension,1);

	for (std::size_t j = 0; j < Bb; ++j) {//columns of B
		std::size_t nc = std::min(BC, N - j * BC);
		//We have to make use of the triangular nature of B and the fact that rhs and storage are the same matrix
		//for upper triangular matrices we can compute whole columns of A starting from the first
		//until we reach the block on the diagonal, where we stop.
		//for lower triangular matrices we start with the last column instead.
		for (std::size_t k0 = 0; k0< Ab; ++k0){//row-blocks of B = column blocks of A.
			std::size_t k = Triangular::is_upper? k0: Ab-k0-1;
			std::size_t kc = std::min(AC, M - k * AC);
			//read block of B
			auto Bs = subrange(e2, k*AC, k*AC + kc, j * BC, j * BC + nc );
			pack_B_dense(Bs, B, block_size());
			Bs.clear();//its going to be overwritten with the result

			//apply block of B to all blocks of A needing it. we will overwrite the real B block as a result of this.
			//this is okay as the block is stored as argument
			std::size_t i_start = Triangular::is_upper? 0: k;
			std::size_t i_end = Triangular::is_upper? k+1: Ab;
			for (std::size_t i = i_start; i < i_end; ++i) {
				std::size_t mc = std::min(AC, M - i * AC);
				auto As = subrange(e1, i * AC, i * AC + mc, k * AC, k * AC + kc);
				if(i == k){
					pack_A_triangular(As, A, block_size(), t);
				}else
					pack_A_dense(As, A, block_size());

				mgemm(
					mc, nc, kc, value_type(1.0), A, B,
					&Bpointer[i*AC * stride1 + j*BC * stride2], stride1, stride2, block_size()
				);
			}
		}
	}
	//free storage
	allocator.deallocate(A,AC * AC);
	allocator.deallocate(B,AC * BC);
}